

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsassa_pkcs1_v15_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  uchar *output;
  uchar *output_00;
  size_t sVar4;
  uchar *B;
  uchar *A;
  
  if ((mode == 1) && (ctx->padding != 0)) {
    return -0x4080;
  }
  iVar3 = rsa_rsassa_pkcs1_v15_encode(md_alg,hashlen,hash,ctx->len,sig);
  if (iVar3 != 0) {
    return iVar3;
  }
  if (mode == 0) {
    iVar3 = mbedtls_rsa_public(ctx,sig,sig);
    return iVar3;
  }
  sVar1 = ctx->len;
  output = (uchar *)calloc(1,sVar1);
  iVar3 = -0x10;
  if (output == (uchar *)0x0) {
    return -0x10;
  }
  output_00 = (uchar *)calloc(1,sVar1);
  if (output_00 == (uchar *)0x0) goto LAB_0012206f;
  iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,output);
  if ((iVar3 == 0) && (iVar3 = mbedtls_rsa_public(ctx,output,output_00), iVar3 == 0)) {
    sVar1 = ctx->len;
    if (sVar1 != 0) {
      bVar2 = 0;
      sVar4 = 0;
      do {
        bVar2 = bVar2 | sig[sVar4] ^ output_00[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
      iVar3 = -0x4300;
      if (bVar2 != 0) goto LAB_00122042;
    }
    memcpy(sig,output,sVar1);
    iVar3 = 0;
  }
LAB_00122042:
  free(output);
  output = output_00;
LAB_0012206f:
  free(output);
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_sign( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               unsigned char *sig )
{
    int ret;
    unsigned char *sig_try = NULL, *verif = NULL;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * Prepare PKCS1-v1.5 encoding (padding and hash identifier)
     */

    if( ( ret = rsa_rsassa_pkcs1_v15_encode( md_alg, hashlen, hash,
                                             ctx->len, sig ) ) != 0 )
        return( ret );

    /*
     * Call respective RSA primitive
     */

    if( mode == MBEDTLS_RSA_PUBLIC )
    {
        /* Skip verification on a public key operation */
        return( mbedtls_rsa_public( ctx, sig, sig ) );
    }

    /* Private key operation
     *
     * In order to prevent Lenstra's attack, make the signature in a
     * temporary buffer and check it before returning it.
     */

    sig_try = mbedtls_calloc( 1, ctx->len );
    if( sig_try == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    verif = mbedtls_calloc( 1, ctx->len );
    if( verif == NULL )
    {
        mbedtls_free( sig_try );
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );
    }

    MBEDTLS_MPI_CHK( mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig_try ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_public( ctx, sig_try, verif ) );

    if( mbedtls_safer_memcmp( verif, sig, ctx->len ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_PRIVATE_FAILED;
        goto cleanup;
    }

    memcpy( sig, sig_try, ctx->len );

cleanup:
    mbedtls_free( sig_try );
    mbedtls_free( verif );

    return( ret );
}